

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

double __thiscall mp::NLModel::ComputeObjValue(NLModel *this,double *x)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  double dVar7;
  
  dVar7 = this->obj_c0_;
  iVar1 = (this->vars_).num_col_;
  lVar3 = (long)iVar1;
  if (lVar3 != 0) {
    lVar5 = lVar3;
    do {
      dVar7 = dVar7 + this->obj_c_[lVar5 + -1] * x[lVar5 + -1];
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  sVar4 = (this->Q_).num_nz_;
  if (iVar1 != 0 && sVar4 != 0) {
    do {
      sVar2 = (this->Q_).start_[lVar3 + -1];
      lVar3 = lVar3 + -1;
      if (sVar2 != sVar4) {
        sVar6 = sVar2;
        do {
          dVar7 = dVar7 + (this->Q_).value_[sVar6] * 0.5 * x[lVar3] * x[(this->Q_).index_[sVar6]];
          sVar6 = sVar6 + 1;
        } while (sVar4 != sVar6);
      }
      sVar4 = sVar2;
    } while (lVar3 != 0);
  }
  return dVar7;
}

Assistant:

double NLModel::ComputeObjValue(const double *x) const {
  double result {obj_c0_};
  for (auto i=NumCols(); i--; )
    result += obj_c_[i] * x[i];
  if (Q_.num_nz_) {
    auto pos_end = Q_.num_nz_;
    for (auto i=NumCols(); i--; ) {
      for (auto pos=Q_.start_[i]; pos!=pos_end; ++pos) {
        result
            += 0.5 * Q_.value_[pos] * x[i] * x[Q_.index_[pos]];
      }
      pos_end = Q_.start_[i];
    }
  }
  return result;
}